

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

void __thiscall fizplex::Base::ftran(Base *this,SVector *vec)

{
  pointer pEVar1;
  pointer pNVar2;
  unsigned_long *puVar3;
  Nonzero *entry;
  pointer pNVar4;
  vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *__range1;
  SVector *__range1_1;
  ETM *etm;
  pointer etm_00;
  
  pEVar1 = (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (etm_00 = (this->etms).
                super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
                super__Vector_impl_data._M_start; etm_00 != pEVar1; etm_00 = etm_00 + 1) {
    apply_etm(this,etm_00,vec);
  }
  pNVar4 = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (vec->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar4 != pNVar2) {
    puVar3 = (this->row_ordering)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    do {
      pNVar4->index = puVar3[pNVar4->index];
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != pNVar2);
  }
  return;
}

Assistant:

void Base::ftran(SVector &vec) {
  for (auto &etm : etms)
    apply_etm(etm, vec);

  // Reorder vec according to base column swaps
  for (auto &entry : vec)
    entry.index = row_ordering[entry.index];
}